

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 float128_to_float64_m68k(float128 a,float_status *status)

{
  commonNaNT a_00;
  float128 a_01;
  float128 a_02;
  float128 a_03;
  float128 a_04;
  commonNaNT local_58;
  uint64_t local_40;
  uint64_t aSig1;
  uint64_t aSig0;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  float128 a_local;
  
  a_local.low = a.high;
  status_local = (float_status *)a.low;
  _aExp = status;
  local_40 = extractFloat128Frac1(a);
  a_01.high = a_local.low;
  a_01.low = (uint64_t)status_local;
  aSig1 = extractFloat128Frac0(a_01);
  a_02.high = a_local.low;
  a_02.low = (uint64_t)status_local;
  aSig0._0_4_ = extractFloat128Exp(a_02);
  a_03.high = a_local.low;
  a_03.low = (uint64_t)status_local;
  aSig0._7_1_ = extractFloat128Sign(a_03);
  if ((int32_t)aSig0 == 0x7fff) {
    if (aSig1 == 0 && local_40 == 0) {
      a_local.high = packFloat64(aSig0._7_1_,0x7ff,0);
    }
    else {
      a_04.high = a_local.low;
      a_04.low = (uint64_t)status_local;
      float128ToCommonNaN(&local_58,a_04,_aExp);
      a_00.high = local_58.high;
      a_00.sign = local_58.sign;
      a_00._1_7_ = local_58._1_7_;
      a_00.low = local_58.low;
      a_local.high = commonNaNToFloat64(a_00,_aExp);
    }
  }
  else {
    shortShift128Left(aSig1,local_40,0xe,&aSig1,&local_40);
    aSig1 = (long)(int)(uint)(local_40 != 0) | aSig1;
    if (((int32_t)aSig0 != 0) || (aSig1 != 0)) {
      aSig1 = aSig1 | 0x4000000000000000;
      aSig0._0_4_ = (int32_t)aSig0 + -0x3c01;
    }
    a_local.high = roundAndPackFloat64(aSig0._7_1_,(int32_t)aSig0,aSig1,_aExp);
  }
  return a_local.high;
}

Assistant:

float64 float128_to_float64(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 ) {
            return commonNaNToFloat64(float128ToCommonNaN(a, status), status);
        }
        return packFloat64( aSign, 0x7FF, 0 );
    }
    shortShift128Left( aSig0, aSig1, 14, &aSig0, &aSig1 );
    aSig0 |= ( aSig1 != 0 );
    if ( aExp || aSig0 ) {
        aSig0 |= UINT64_C(0x4000000000000000);
        aExp -= 0x3C01;
    }
    return roundAndPackFloat64(aSign, aExp, aSig0, status);

}